

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

StatementMap *
Js::FunctionBody::GetPrevNonSubexpressionStatementMap
          (StatementMapList *statementMapList,int *startingAtIndex)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  WriteBarrierPtr *pWVar5;
  StatementMap **ppSVar6;
  byte local_29;
  StatementMapList *local_28;
  StatementMap *map;
  int *startingAtIndex_local;
  StatementMapList *statementMapList_local;
  
  if (statementMapList == (StatementMapList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xb4f,"(statementMapList != nullptr)",
                                "Must have valid statementMapList to execute");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pWVar5 = (WriteBarrierPtr *)
           JsUtil::
           List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(statementMapList,*startingAtIndex);
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(pWVar5);
  local_28 = (StatementMapList *)*ppSVar6;
  while( true ) {
    local_29 = 0;
    if (*startingAtIndex != 0) {
      local_29 = *(byte *)&(local_28->
                           super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                           ).count;
    }
    if ((local_29 & 1) == 0) break;
    iVar1 = *startingAtIndex;
    *startingAtIndex = iVar1 + -1;
    pWVar5 = (WriteBarrierPtr *)
             JsUtil::
             List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(statementMapList,iVar1 + -1);
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(pWVar5);
    local_28 = (StatementMapList *)*ppSVar6;
  }
  if ((*(Type *)&(local_28->
                 super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                 ).count & 1U) == 0) {
    statementMapList_local = local_28;
  }
  else {
    statementMapList_local = (StatementMapList *)0x0;
  }
  return (StatementMap *)statementMapList_local;
}

Assistant:

FunctionBody::StatementMap * FunctionBody::GetPrevNonSubexpressionStatementMap(StatementMapList *statementMapList, int & startingAtIndex)
    {
        AssertMsg(statementMapList != nullptr, "Must have valid statementMapList to execute");

        StatementMap *map = statementMapList->Item(startingAtIndex);
        while (startingAtIndex && map->isSubexpression)
        {
            map = statementMapList->Item(--startingAtIndex);
        }
        if (map->isSubexpression)   // Didn't find any non inner maps
        {
            return nullptr;
        }
        return map;
    }